

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::MeanVarianceNormalizeLayerParams::_InternalParse
          (MeanVarianceNormalizeLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *p;
  char cVar5;
  uint uVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  float *local_30;
  
  local_30 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_30;
      uVar6 = (uint)bVar1;
      p = (float *)((long)local_30 + 1);
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar6);
          p = (float *)pVar7.first;
          uVar6 = pVar7.second;
        }
        else {
          p = (float *)((long)local_30 + 2);
        }
      }
      uVar3 = uVar6 >> 3;
      cVar5 = (char)uVar6;
      local_30 = p;
      if (uVar3 == 3) {
        if (cVar5 != '\x1d') goto LAB_00279332;
        this->epsilon_ = *p;
        local_30 = p + 1;
      }
      else {
        if (uVar3 == 2) {
          if (cVar5 == '\x10') {
            uVar4 = (ulong)(char)*(byte *)p;
            local_30 = (float *)((long)p + 1);
            if ((long)uVar4 < 0) {
              uVar6 = ((uint)*(byte *)local_30 * 0x80 + (uint)*(byte *)p) - 0x80;
              if ((char)*(byte *)local_30 < '\0') {
                local_30 = p;
                pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar6);
                local_30 = (float *)pVar8.first;
                this->normalizevariance_ = pVar8.second != 0;
                goto LAB_0027936e;
              }
              uVar4 = (ulong)uVar6;
              local_30 = (float *)((long)p + 2);
            }
            this->normalizevariance_ = uVar4 != 0;
            goto LAB_00279373;
          }
LAB_00279332:
          if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
            if (p == (float *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
            return (char *)p;
          }
          uVar4 = this_00->ptr_;
          if ((uVar4 & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((uVar4 & 0xfffffffffffffffc) + 8);
          }
          local_30 = (float *)google::protobuf::internal::UnknownFieldParse
                                        (uVar6,unknown,(char *)local_30,ctx);
        }
        else {
          if ((uVar3 != 1) || (cVar5 != '\b')) goto LAB_00279332;
          uVar4 = (ulong)(char)*(byte *)p;
          local_30 = (float *)((long)p + 1);
          if (-1 < (long)uVar4) {
LAB_002792c2:
            this->acrosschannels_ = uVar4 != 0;
            goto LAB_00279373;
          }
          uVar6 = ((uint)*(byte *)local_30 * 0x80 + (uint)*(byte *)p) - 0x80;
          if (-1 < (char)*(byte *)local_30) {
            uVar4 = (ulong)uVar6;
            local_30 = (float *)((long)p + 2);
            goto LAB_002792c2;
          }
          local_30 = p;
          pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar6);
          local_30 = (float *)pVar8.first;
          this->acrosschannels_ = pVar8.second != 0;
        }
LAB_0027936e:
        if (local_30 == (float *)0x0) {
          return (char *)0x0;
        }
      }
LAB_00279373:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* MeanVarianceNormalizeLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // bool acrossChannels = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          acrosschannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool normalizeVariance = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          normalizevariance_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float epsilon = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 29)) {
          epsilon_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}